

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactive.cpp
# Opt level: O1

int main(void)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  string input;
  Pyraminx myPyraminx;
  byte *local_c8;
  long local_c0;
  byte local_b8 [16];
  string local_a8;
  Pyraminx local_88;
  
  Pyraminx::Pyraminx(&local_88);
  local_c8 = local_b8;
  local_c0 = 0;
  local_b8[0] = 0;
  puts(
      "Enter a command of the form AX[`] where L is the letter corresponding with a \ncorner of the Pyraminx (U, L, R, B),  X is a integer from 0-3 specifying the \nlayer of the row relative to the tip (layer 0) at the corner given, and the \noptional ` mark indicates whether the layer should be turned counterclockwise.\nThe default rotation is clockwise. The corner characters are case insensitive.\nThere should be no spaces in your command.\nEnter \'s\' to scramble, \'q\' to quit."
      );
  Pyraminx::print(&local_88);
  do {
    do {
      printf("Enter command: ");
      cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '8');
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_c8,cVar2);
    } while (local_c0 == 0);
    bVar1 = *local_c8;
    if (bVar1 < 0x71) {
      if (bVar1 == 0x53) goto LAB_001044aa;
      if (bVar1 == 0x51) goto LAB_00104539;
LAB_001044be:
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_c8,local_c8 + local_c0);
      input_to_turn(&local_88,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
    }
    else {
      if (bVar1 != 0x73) {
        if (bVar1 != 0x71) goto LAB_001044be;
LAB_00104539:
        if (local_c8 != local_b8) {
          operator_delete(local_c8);
        }
        if (local_88.green_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.green_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_88.yellow_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.yellow_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_88.red_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.red_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_88.blue_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.blue_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::vector<std::shared_ptr<Face>,_std::allocator<std::shared_ptr<Face>_>_>::~vector
                  (&local_88.face_list);
        return 0;
      }
LAB_001044aa:
      Pyraminx::scramble(&local_88,0x14);
    }
    putchar(10);
    Pyraminx::print(&local_88);
    uVar4 = Pyraminx::get_heuristic(&local_88);
    printf("H: %i\n",(ulong)uVar4);
    bVar3 = Pyraminx::is_solved(&local_88);
    if (bVar3) {
      puts("Solved!");
    }
  } while( true );
}

Assistant:

int main(){
    Pyraminx myPyraminx;
    std::string input;
    bool quit = false;
    printf("Enter a command of the form AX[`] where L is the letter corresponding with a \n"
           "corner of the Pyraminx (U, L, R, B),  X is a integer from 0-3 specifying the \n"
           "layer of the row relative to the tip (layer 0) at the corner given, and the \n"
           "optional ` mark indicates whether the layer should be turned counterclockwise.\n"
           "The default rotation is clockwise. The corner characters are case insensitive.\n"
           "There should be no spaces in your command.\n"
           "Enter 's' to scramble, 'q' to quit.\n");
    myPyraminx.print();
    while(!quit){
        printf("Enter command: ");
        std::getline (std::cin, input);
        if(!input.empty()){
            if(input[0] == 'q' || input[0] == 'Q'){
                quit = true;
                continue;
            }
            else if(input[0] == 's' || input[0] == 'S'){
                myPyraminx.scramble(20);
            }
            else{
                input_to_turn(myPyraminx, input);
            }
            printf("\n");
            myPyraminx.print();
            printf("H: %i\n", myPyraminx.get_heuristic());
            if(myPyraminx.is_solved()){
                printf("Solved!\n");
            }
        } //if not empty
    }// while
}